

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwPortTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  reference ppAVar2;
  size_type sVar3;
  AmpIO *pAVar4;
  undefined1 *puVar5;
  undefined1 auStack_ee8 [1592];
  undefined8 uStack_8b0;
  undefined1 auStack_8a8 [15];
  uchar local_899;
  ulong local_898;
  void *local_890;
  void *local_888;
  ostream *local_880;
  ostream *local_878;
  ostream *local_870;
  undefined1 *local_868;
  AmpIO *local_860;
  void *local_858;
  __uint32_t local_84c;
  void *local_848;
  ostream *local_840;
  ostream *local_838;
  byte local_829;
  ostream *local_828;
  ostream *local_820;
  uchar local_811;
  ulong local_810;
  ostream *local_808;
  undefined1 local_7f9;
  nodeaddr_t local_7f8;
  __uint32_t local_7ec;
  void *local_7e8;
  nodeid_t local_7da;
  void *local_7d8;
  ostream *local_7d0;
  AmpIO *local_7c8;
  void *local_7c0;
  ostream *local_7b8;
  ostream *local_7b0;
  undefined1 local_7a5;
  _Ios_Openmode local_7a4;
  ostream *local_7a0;
  int local_794;
  ulong local_790;
  size_t i_5;
  double mtime;
  undefined8 uStack_778;
  int i_4;
  unsigned_long __vla_expr0;
  long lStack_768;
  timeval prev;
  timeval start;
  int csize;
  int counter;
  size_t j;
  size_t i_3;
  AmpIO *board;
  size_t i_2;
  size_t i_1;
  undefined8 uStack_710;
  quadlet_t dataQuadlet;
  nodeaddr_t nodeaddress_wd;
  AmpIO *pAStack_700;
  bool rc;
  ulong local_6f8;
  size_t i;
  undefined1 local_6e8 [8];
  FirewirePort fwport;
  stringstream debugStream;
  char local_54 [4];
  int next_option;
  char short_options [4];
  vector<AmpIO_*,_std::allocator<AmpIO_*>_> BoardList;
  int board_id [4];
  size_t numBoards;
  int port;
  char **argv_local;
  int argc_local;
  
  numBoards._4_4_ = 0;
  uStack_8b0 = 0x1049b7;
  std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::vector
            ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option);
  builtin_strncpy(local_54,"hp:",4);
  do {
    uStack_8b0 = 0x1049ec;
    iVar1 = getopt(argc,argv,local_54);
    local_794 = iVar1;
    if (iVar1 != -1) {
      if (iVar1 == 0x68) {
        uStack_8b0 = 0x104a1e;
        ShowUsage();
      }
      else {
        if (iVar1 != 0x70) {
          uStack_8b0 = 0x104a7f;
          abort();
        }
        uStack_8b0 = 0x104a42;
        numBoards._4_4_ = atoi(_optarg);
        uStack_8b0 = 0x104a58;
        local_7a0 = std::operator<<((ostream *)&std::cout,"using port number");
        uStack_8b0 = 0x104a74;
        std::ostream::operator<<(local_7a0,std::endl<char,std::char_traits<char>>);
      }
    }
  } while (iVar1 != -1);
  uStack_8b0 = 0x104a9a;
  local_7a4 = std::operator|(_S_out,_S_in);
  uStack_8b0 = 0x104ab4;
  std::__cxx11::stringstream::stringstream((stringstream *)&fwport.old_reset_handler,local_7a4);
  uStack_8b0 = 0x104acc;
  FirewirePort::FirewirePort((FirewirePort *)local_6e8,numBoards._4_4_,(ostream *)&std::cout);
  uStack_8b0 = 0x104ada;
  local_7a5 = FirewirePort::IsOK((FirewirePort *)local_6e8);
  if ((bool)local_7a5) {
    uStack_8b0 = 0x104b6a;
    local_7b8 = std::operator<<((ostream *)&std::cout,"Open port on ");
    uStack_8b0 = 0x104b82;
    local_7c0 = (void *)std::ostream::operator<<(local_7b8,numBoards._4_4_);
    uStack_8b0 = 0x104b9e;
    std::ostream::operator<<(local_7c0,std::endl<char,std::char_traits<char>>);
    for (local_6f8 = 0; local_6f8 < 4; local_6f8 = local_6f8 + 1) {
      uStack_8b0 = 0x104bc5;
      local_7c8 = (AmpIO *)operator_new(0xe58);
      uStack_8b0 = 0x104be6;
      AmpIO::AmpIO(local_7c8,(uint8_t)board_id[local_6f8 - 2]);
      pAStack_700 = local_7c8;
      uStack_8b0 = 0x104c06;
      std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::push_back
                ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,&stack0xfffffffffffff900)
      ;
      uStack_8b0 = 0x104c18;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,local_6f8);
      uStack_8b0 = 0x104c27;
      FirewirePort::AddBoard((FirewirePort *)local_6e8,(BoardIO *)*ppAVar2);
      uStack_8b0 = 0x104c3c;
      local_7d0 = std::operator<<((ostream *)&std::cout,"new board with node_id = ");
      uStack_8b0 = 0x104c58;
      local_7d8 = (void *)std::ostream::operator<<(local_7d0,std::dec);
      uStack_8b0 = 0x104c79;
      local_7da = BasePort::GetNodeId((BasePort *)local_6e8,(uchar)board_id[local_6f8 - 2]);
      uStack_8b0 = 0x104c98;
      local_7e8 = (void *)std::ostream::operator<<(local_7d8,local_7da);
      uStack_8b0 = 0x104cb4;
      std::ostream::operator<<(local_7e8,std::endl<char,std::char_traits<char>>);
    }
    uStack_710 = 0xffffff000003;
    local_7f8 = 0xffffff000003;
    uStack_8b0 = 0x104d1a;
    local_7ec = __bswap_32(0x3888);
    uStack_8b0 = 0x104d40;
    local_7f9 = BasePort::WriteQuadlet((BasePort *)local_6e8,'?',local_7f8,local_7ec);
    nodeaddress_wd._7_1_ = local_7f9;
    if (!(bool)local_7f9) {
      uStack_8b0 = 0x104d72;
      local_808 = std::operator<<((ostream *)&std::cerr,"Quadlet broadcast error");
      uStack_8b0 = 0x104d8e;
      std::ostream::operator<<(local_808,std::endl<char,std::char_traits<char>>);
    }
    i_2 = 0;
    while( true ) {
      i_1._4_4_ = 0;
      local_810 = i_2;
      uStack_8b0 = 0x104dbe;
      sVar3 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size
                        ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option);
      if (sVar3 <= local_810) break;
      uStack_8b0 = 0x104de1;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,i_2);
      uStack_8b0 = 0x104de9;
      local_811 = BoardIO::GetBoardId((BoardIO *)*ppAVar2);
      uStack_8b0 = 0x104e12;
      BasePort::ReadQuadlet((BasePort *)local_6e8,local_811,3,(quadlet_t *)((long)&i_1 + 4));
      uStack_8b0 = 0x104e27;
      local_820 = (ostream *)std::ostream::operator<<(&std::cout,std::dec);
      uStack_8b0 = 0x104e43;
      local_828 = std::operator<<(local_820,"Board ");
      uStack_8b0 = 0x104e5c;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,i_2);
      uStack_8b0 = 0x104e64;
      local_829 = BoardIO::GetBoardId((BoardIO *)*ppAVar2);
      uStack_8b0 = 0x104e81;
      local_838 = (ostream *)std::ostream::operator<<(local_828,(uint)local_829);
      uStack_8b0 = 0x104e9d;
      local_840 = std::operator<<(local_838," watchdog = ");
      uStack_8b0 = 0x104eb9;
      local_848 = (void *)std::ostream::operator<<(local_840,std::hex);
      uStack_8b0 = 0x104ecd;
      local_84c = __bswap_32(i_1._4_4_);
      uStack_8b0 = 0x104ee7;
      local_858 = (void *)std::ostream::operator<<(local_848,local_84c);
      uStack_8b0 = 0x104f03;
      std::ostream::operator<<(local_858,std::endl<char,std::char_traits<char>>);
      i_2 = i_2 + 1;
    }
    board = (AmpIO *)0x0;
    while( true ) {
      local_860 = board;
      uStack_8b0 = 0x104f48;
      pAVar4 = (AmpIO *)std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size
                                  ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option);
      if (pAVar4 <= local_860) break;
      uStack_8b0 = 0x104f6b;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,
                           (size_type)board);
      uStack_8b0 = 0x104f78;
      AmpIO::WriteSafetyRelay(*ppAVar2,true);
      uStack_8b0 = 0x104f8a;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,
                           (size_type)board);
      uStack_8b0 = 0x104f97;
      AmpIO::WritePowerEnable(*ppAVar2,true);
      uStack_8b0 = 0x104fa3;
      usleep(40000);
      uStack_8b0 = 0x104fb5;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,
                           (size_type)board);
      uStack_8b0 = 0x104fc4;
      AmpIO::WriteAmpEnable(*ppAVar2,0xf,0xf);
      board = (AmpIO *)((long)&(board->super_FpgaIO).super_BoardIO._vptr_BoardIO + 1);
    }
    for (j = 0; j < 4; j = j + 1) {
      uStack_8b0 = 0x105004;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,j);
      pAVar4 = *ppAVar2;
      for (_csize = 0; _csize < 4; _csize = _csize + 1) {
        uStack_8b0 = 0x105040;
        AmpIO::SetMotorCurrent(pAVar4,csize,csize * 0x200 + 0x8000);
      }
    }
    start.tv_usec._4_4_ = 0;
    uStack_778 = 100;
    local_868 = auStack_ee8;
    __vla_expr0 = (unsigned_long)auStack_8a8;
    gettimeofday((timeval *)&prev.tv_usec,(__timezone_ptr_t)0x0);
    while (start.tv_usec._4_4_ < 100) {
      BasePort::ReadAllBoardsBroadcast((BasePort *)local_6e8);
      BasePort::WriteAllBoardsBroadcast((BasePort *)local_6e8);
      gettimeofday((timeval *)(local_868 + (long)start.tv_usec._4_4_ * 0x10),(__timezone_ptr_t)0x0);
      start.tv_usec._4_4_ = start.tv_usec._4_4_ + 1;
    }
    lStack_768 = prev.tv_usec;
    prev.tv_sec = start.tv_sec;
    for (mtime._4_4_ = 0; mtime._4_4_ < 100; mtime._4_4_ = mtime._4_4_ + 1) {
      i_5 = (size_t)((double)(*(long *)(local_868 + (long)mtime._4_4_ * 0x10) - lStack_768) *
                     1000000.0 +
                     (double)(*(long *)(local_868 + (long)mtime._4_4_ * 0x10 + 8) - prev.tv_sec) +
                    0.5);
      lStack_768 = *(long *)(local_868 + (long)mtime._4_4_ * 0x10);
      prev.tv_sec = *(long *)((long)(local_868 + (long)mtime._4_4_ * 0x10) + 8);
      local_870 = std::operator<<((ostream *)&std::cout,"time ");
      local_878 = (ostream *)std::ostream::operator<<(local_870,mtime._4_4_);
      local_880 = std::operator<<(local_878," = ");
      local_888 = (void *)std::ostream::operator<<(local_880,std::dec);
      local_890 = (void *)std::ostream::operator<<(local_888,(double)i_5);
      std::ostream::operator<<(local_890,std::endl<char,std::char_traits<char>>);
    }
    local_790 = 0;
    while( true ) {
      local_898 = local_790;
      sVar3 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size
                        ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option);
      if (sVar3 <= local_898) break;
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,local_790);
      AmpIO::WriteSafetyRelay(*ppAVar2,false);
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,local_790);
      AmpIO::WriteAmpEnable(*ppAVar2,0xf,0);
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,local_790);
      AmpIO::WritePowerEnable(*ppAVar2,false);
      ppAVar2 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[]
                          ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option,local_790);
      local_899 = BoardIO::GetBoardId((BoardIO *)*ppAVar2);
      FirewirePort::RemoveBoard((FirewirePort *)local_6e8,local_899);
      local_790 = local_790 + 1;
    }
    argv_local._4_4_ = 0;
    puVar5 = (undefined1 *)__vla_expr0;
  }
  else {
    uStack_8b0 = 0x104b01;
    local_7b0 = std::operator<<((ostream *)&std::cerr,"Failed to initialize firewire port");
    uStack_8b0 = 0x104b1d;
    std::ostream::operator<<(local_7b0,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
    puVar5 = auStack_8a8;
  }
  i._4_4_ = 1;
  *(undefined8 *)(puVar5 + -8) = 0x105386;
  FirewirePort::~FirewirePort((FirewirePort *)local_6e8);
  *(undefined8 *)(puVar5 + -8) = 0x105392;
  std::__cxx11::stringstream::~stringstream((stringstream *)&fwport.old_reset_handler);
  *(undefined8 *)(puVar5 + -8) = 0x10539b;
  std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::~vector
            ((vector<AmpIO_*,_std::allocator<AmpIO_*>_> *)&next_option);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    // declare variables and default values
    int port = 0;
    const size_t numBoards = 4;
    int board_id[numBoards] = {BoardIO::MAX_BOARDS, BoardIO::MAX_BOARDS};
    std::vector<AmpIO*> BoardList;

    // set board id
    board_id[0] = 2;
    board_id[1] = 3;
    board_id[2] = 6;
    board_id[3] = 7;

    // command line option setup
    const char short_options[] = "hp:";
    int next_option;
    do {
        next_option = getopt(argc, argv, short_options);
        switch (next_option)
        {
        case 'h':
            ShowUsage();
            break;
        case 'p':
            port = atoi(optarg);
            std::cout << "using port number" << std::endl;
            break;
        case -1:  // parsing done
            break;
        default:  // should NEVER happen
            abort();
        }
    }
    while (next_option != -1);

    // ---------------------------------------------------
    // Firewire port
    // ZC: really this port number should be interactive
    // ---------------------------------------------------
    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    FirewirePort fwport(port, std::cout);
    if (!fwport.IsOK()) {
        std::cerr << "Failed to initialize firewire port" << std::endl;
        return EXIT_FAILURE;
    } else {
        std::cout << "Open port on " << port << std::endl;
    }

    // Create AmpIO board 1 and 2
    for (size_t i = 0; i < numBoards; i++) {
        BoardList.push_back(new AmpIO(board_id[i]));
        fwport.AddBoard(BoardList[i]);
        std::cout << "new board with node_id = " << std::dec
                  << fwport.GetNodeId(board_id[i]) << std::endl;
    }

    // ----- ---------------------------------
    // Quadlet broadcast
    // ---------------------------------------
    bool rc;
    nodeaddr_t nodeaddress_wd = 0xffffff000003;
    rc = fwport.WriteQuadlet(FW_NODE_BROADCAST, nodeaddress_wd, bswap_32(0x3888));
    if (!rc) {
        std::cerr << "Quadlet broadcast error" << std::endl;
    }

    // now read back and verify
    quadlet_t dataQuadlet = 0x0000;
    for (size_t i = 0; i < BoardList.size(); i++) {
        fwport.ReadQuadlet(BoardList[i]->GetBoardId(), 0x03, dataQuadlet);
        std::cout << std::dec << "Board " << (int) BoardList[i]->GetBoardId()
                  << " watchdog = " << std::hex << bswap_32(dataQuadlet) << std::endl;
        dataQuadlet = 0x0000; // clear value
    }

    // ----- ---------------------------------
    // Block broadcast
    // --------------------------------------
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(true);
        BoardList[i]->WritePowerEnable(true);
        usleep(40000); // sleep 40 ms
        BoardList[i]->WriteAmpEnable(0x0f, 0x0f);
    }

    AmpIO* board;
    for (size_t i = 0; i < numBoards; i++) {
        board = BoardList[i];
        // set current for all boards
        for (size_t j = 0; j < 4; j++) {
            board->SetMotorCurrent(j, 0x8000 + 0x200 * j);
        }
    }

	
    // ----- ---------------------------------
    // Broadcast Write/Read boards
    // ---------------------------------------

    int counter = 0;
    int csize = 100;
    timeval start, prev;
    timeval stop[csize];

    gettimeofday(&start, NULL);
    while(counter < csize){
        counter++;
        fwport.ReadAllBoardsBroadcast();
        fwport.WriteAllBoardsBroadcast();
        gettimeofday(&stop[counter-1], NULL);
    }

    prev = start;
    for (int i = 0; i < csize; i++) {
        double mtime;
        mtime = (stop[i].tv_sec - prev.tv_sec) * 1000000.0 +
                (stop[i].tv_usec - prev.tv_usec) + 0.5;
        prev = stop[i];

        std::cout << "time " << i << " = " << std::dec << mtime << std::endl;
    }


    // Shut down boards and remove from port
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(false);
        BoardList[i]->WriteAmpEnable(0x0f, 0);   // Turn power off
        BoardList[i]->WritePowerEnable(false);   // Turn power off
        fwport.RemoveBoard(BoardList[i]->GetBoardId());
    }

    return EXIT_SUCCESS;
}